

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_load_all(void)

{
  wchar_t w;
  wchar_t h;
  int *piVar1;
  int *piVar2;
  term *ptVar3;
  undefined8 *p;
  ulong uVar4;
  term_win *ptVar5;
  undefined8 *puVar6;
  
  ptVar5 = Term->mem;
  if (ptVar5 != (term_win *)0x0) {
    w = Term->wid;
    h = Term->hgt;
    puVar6 = (undefined8 *)0x0;
    do {
      p = (undefined8 *)mem_alloc(0x10);
      *p = ptVar5;
      p[1] = puVar6;
      ptVar5 = ptVar5->next;
      puVar6 = p;
    } while (ptVar5 != (term_win *)0x0);
    do {
      puVar6 = (undefined8 *)p[1];
      term_win_copy(Term->scr,(term_win *)*p,w,h);
      mem_free(p);
      ptVar3 = Term;
      if (L'\0' < h) {
        piVar1 = Term->x1;
        piVar2 = Term->x2;
        uVar4 = 0;
        do {
          piVar1[uVar4] = 0;
          piVar2[uVar4] = w + L'\xffffffff';
          uVar4 = uVar4 + 1;
        } while ((uint)h != uVar4);
      }
      ptVar3->y1 = 0;
      ptVar3->y2 = h + L'\xffffffff';
      Term_fresh();
      p = puVar6;
    } while (puVar6 != (undefined8 *)0x0);
  }
  ptVar5 = Term->mem;
  if (ptVar5 != (term_win *)0x0) {
    Term->mem = ptVar5->next;
    term_win_nuke(ptVar5);
    mem_free(ptVar5);
  }
  Term->saved = Term->saved + 0xff;
  return 0;
}

Assistant:

errr Term_load_all(void)
{
	int w = Term->wid;
	int h = Term->hgt;
	struct reversed_save {
		term_win *saved_mem; struct reversed_save *next;
	} *reversed_list = NULL;
	struct term_win *cursor;

	for (cursor = Term->mem; cursor; cursor = cursor->next) {
		struct reversed_save *new_head = mem_alloc(sizeof(*new_head));

		new_head->saved_mem = cursor;
		new_head->next = reversed_list;
		reversed_list = new_head;
	}

	while (reversed_list) {
		struct reversed_save *tgt = reversed_list;
		int y;

		reversed_list = reversed_list->next;
		term_win_copy(Term->scr, tgt->saved_mem, w, h);
		mem_free(tgt);

		/* Assume change */
		for (y = 0; y < h; y++) {
			/* Assume change */
			Term->x1[y] = 0;
			Term->x2[y] = w - 1;
		}
		Term->y1 = 0;
		Term->y2 = h - 1;

		/* Force a redraw with those contents. */
		Term_fresh();
	}

	/* Drop the most recent save. */
	if (Term->mem) {
		cursor = Term->mem;
		Term->mem = Term->mem->next;
		term_win_nuke(cursor);
		mem_free(cursor);
	}
	Term->saved--;

	/* Success */
	return (0);
}